

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O2

void __thiscall HighsMipSolverData::setupDomainPropagation(HighsMipSolverData *this)

{
  uint uVar1;
  HighsLp *pHVar2;
  HighsMipSolver *mipsolver;
  pointer piVar3;
  pointer pdVar4;
  ulong uVar5;
  HighsInt j;
  long lVar6;
  double dVar7;
  double dVar8;
  HighsDomain local_350;
  
  pHVar2 = this->mipsolver->model_;
  highsSparseTranspose
            (pHVar2->num_row_,pHVar2->num_col_,&(pHVar2->a_matrix_).start_,
             &(pHVar2->a_matrix_).index_,&(pHVar2->a_matrix_).value_,&this->ARstart_,&this->ARindex_
             ,&this->ARvalue_);
  HighsPseudocost::HighsPseudocost((HighsPseudocost *)&local_350,this->mipsolver);
  HighsPseudocost::operator=(&this->pseudocost,(HighsPseudocost *)&local_350);
  HighsPseudocost::~HighsPseudocost((HighsPseudocost *)&local_350);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->maxAbsRowCoef,(long)this->mipsolver->model_->num_row_);
  mipsolver = this->mipsolver;
  uVar1 = mipsolver->model_->num_row_;
  piVar3 = (this->ARstart_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (this->maxAbsRowCoef).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = 0;
  while (uVar5 != uVar1) {
    dVar7 = 0.0;
    for (lVar6 = (long)piVar3[uVar5]; piVar3[uVar5 + 1] != lVar6; lVar6 = lVar6 + 1) {
      dVar8 = ABS((this->ARvalue_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar6]);
      if (dVar8 <= dVar7) {
        dVar8 = dVar7;
      }
      dVar7 = dVar8;
    }
    pdVar4[uVar5] = dVar7;
    uVar5 = uVar5 + 1;
  }
  HighsDomain::HighsDomain(&local_350,mipsolver);
  HighsDomain::operator=(&this->domain,&local_350);
  HighsDomain::~HighsDomain(&local_350);
  HighsDomain::computeRowActivities(&this->domain);
  return;
}

Assistant:

void HighsMipSolverData::setupDomainPropagation() {
  const HighsLp& model = *mipsolver.model_;
  highsSparseTranspose(model.num_row_, model.num_col_, model.a_matrix_.start_,
                       model.a_matrix_.index_, model.a_matrix_.value_, ARstart_,
                       ARindex_, ARvalue_);

  pseudocost = HighsPseudocost(mipsolver);

  // compute the maximal absolute coefficients to filter propagation
  maxAbsRowCoef.resize(mipsolver.model_->num_row_);
  for (HighsInt i = 0; i != mipsolver.model_->num_row_; ++i) {
    double maxabsval = 0.0;

    HighsInt start = ARstart_[i];
    HighsInt end = ARstart_[i + 1];
    for (HighsInt j = start; j != end; ++j)
      maxabsval = std::max(maxabsval, std::abs(ARvalue_[j]));

    maxAbsRowCoef[i] = maxabsval;
  }

  domain = HighsDomain(mipsolver);
  domain.computeRowActivities();
}